

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O2

bool anon_unknown.dwarf_1cec9a::write_stream(ostream *os,WriteOptions *options,Node *stream)

{
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  bool bVar3;
  undefined1 extraout_AL;
  ostream *poVar4;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string_view sVar6;
  Node value;
  shared_ptr<trieste::NodeDef> directive;
  Node docend;
  Node docstart;
  Node directives;
  shared_ptr<trieste::NodeDef> document;
  Node documents;
  allocator<char> local_111;
  ostream *local_110;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 *local_e0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_d8;
  initializer_list<trieste::Token> local_c8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *local_98;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *local_90;
  Token local_88;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_a8._M_ptr = (element_type *)trieste::yaml::Documents;
  local_110 = os;
  trieste::operator/((WFLookup *)local_f8,stream,(Token *)&local_a8);
  CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8))
  ;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  p_Var5 = &(((local_50._M_ptr)->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  local_98 = &(((local_50._M_ptr)->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  bVar2 = 0;
  do {
    if (p_Var5 == local_98) {
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      return (bool)extraout_AL;
    }
    local_90 = p_Var5;
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,p_Var5);
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&local_60);
    local_108._M_ptr = (element_type *)trieste::yaml::Directives;
    trieste::operator/((WFLookup *)local_f8,(Node *)&local_70,(Token *)&local_108);
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    p_Var5 = &(((local_a8._M_ptr)->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
    p_Var1 = &(((local_a8._M_ptr)->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
    if ((!(bool)(~bVar2 & 1 | p_Var5 == p_Var1)) && (options->canonical == true)) {
      for (; p_Var5 != p_Var1; p_Var5 = p_Var5 + 1) {
        CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_f8,p_Var5);
        CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_f8)
        ;
        if (((local_80._M_ptr)->type_).def == (TokenDef *)&trieste::yaml::VersionDirective) {
          sVar6 = trieste::Location::view(&(local_80._M_ptr)->location_);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_110,sVar6._M_str,sVar6._M_len);
          std::operator<<(poVar4,(string *)options);
        }
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount)
        ;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
      }
    }
    local_b8._M_ptr = (element_type *)&trieste::yaml::Value;
    trieste::operator/((WFLookup *)local_f8,(Node *)&local_70,(Token *)&local_b8);
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    local_d8._M_ptr = (element_type *)trieste::yaml::DocumentStart;
    trieste::operator/((WFLookup *)local_f8,(Node *)&local_70,(Token *)&local_d8);
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    local_c8._M_array = (iterator)trieste::yaml::DocumentEnd;
    trieste::operator/((WFLookup *)local_f8,(Node *)&local_70,(Token *)&local_c8);
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
    if (options->canonical == true) {
      if ((((local_108._M_ptr)->type_).def == (TokenDef *)trieste::yaml::Empty) &&
         (((local_d8._M_ptr)->location_).len == 0)) {
        local_88.def = (TokenDef *)trieste::yaml::Null;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"null",&local_111);
        trieste::operator^((trieste *)&local_c8,&local_88,(string *)local_f8);
        CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_108,
                   (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_len);
        std::__cxx11::string::~string((string *)local_f8);
      }
LAB_00162b8e:
      std::operator<<(local_110,"---");
      local_f8._0_8_ = trieste::yaml::Mapping;
      local_f8._8_8_ = trieste::yaml::FlowMapping;
      local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trieste::yaml::Sequence;
      local_e0 = trieste::yaml::FlowSequence;
      local_c8._M_len = 4;
      local_c8._M_array = (iterator)local_f8;
      bVar3 = trieste::Token::in(&(local_108._M_ptr)->type_,&local_c8);
      if ((bVar3) &&
         (((local_108._M_ptr)->children).
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          ((local_108._M_ptr)->children).
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        std::operator<<(local_110,(string *)options);
      }
      else if (((local_108._M_ptr)->type_).def != (TokenDef *)trieste::yaml::Empty) {
        std::operator<<(local_110," ");
      }
    }
    else if (((local_b8._M_ptr)->location_).len != 0) goto LAB_00162b8e;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = 0;
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&local_108);
    bVar3 = write_value(local_110,options,(Spaces *)local_f8,(Node *)&local_40);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((!bVar3) &&
       ((((local_d8._M_ptr)->location_).len != 0 || ((options->emit_docend & 1U) != 0)))) {
      poVar4 = std::operator<<(local_110,"...");
      std::operator<<(poVar4,(string *)options);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    p_Var5 = local_90 + 1;
    bVar2 = 1;
  } while( true );
}

Assistant:

bool write_stream(std::ostream& os, WriteOptions& options, Node stream)
  {
    Node documents = stream / Documents;
    bool not_first = false;
    for (auto document : *documents)
    {
      write_document(os, options, document, not_first);
      not_first = true;
    }
    return false;
  }